

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

char * __thiscall Pathie::Path::basename(Path *this,char *__filename)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar2 = std::__cxx11::string::compare(__filename);
  if (iVar2 == 0) {
    paVar4 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,".","");
    Path(this,&local_58);
    local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
  }
  else {
    iVar2 = std::__cxx11::string::compare(__filename);
    if (iVar2 == 0) {
      paVar4 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"..","");
      Path(this,&local_78);
      local_38._M_dataplus._M_p = local_78._M_dataplus._M_p;
    }
    else if ((*(long *)(__filename + 8) == 1) && (pcVar1 = *(char **)__filename, *pcVar1 == '/')) {
      paVar4 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar1,pcVar1 + 1);
      Path(this,&local_98);
      local_38._M_dataplus._M_p = local_98._M_dataplus._M_p;
    }
    else {
      lVar3 = std::__cxx11::string::rfind(__filename,0x10f1b8,0xffffffffffffffff);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)&local_38,(ulong)__filename);
        Path(this,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p == &local_38.field_2) {
          return (char *)this;
        }
        goto LAB_00108ca0;
      }
      paVar4 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,*(long *)__filename,
                 *(long *)(__filename + 8) + *(long *)__filename);
      Path(this,&local_b8);
      local_38._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar4) {
    return (char *)this;
  }
LAB_00108ca0:
  operator_delete(local_38._M_dataplus._M_p);
  return (char *)this;
}

Assistant:

Path Path::basename() const
{
  if (m_path == ".")
    return Path(".");
  else if (m_path == "..")
    return Path("..");
  else if (is_root())
    return Path(m_path);

  size_t pos = 0;
  if ((pos = m_path.rfind("/")) != string::npos) // Single = intended
    return Path(m_path.substr(pos + 1));
  else
    return Path(m_path);
}